

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O3

void __thiscall
cfd::api::json::ElementsDecodeLockingScript::ConvertFromStruct
          (ElementsDecodeLockingScript *this,ElementsDecodeLockingScriptStruct *data)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *element;
  pointer pbVar2;
  
  std::__cxx11::string::_M_assign((string *)&this->asm__);
  std::__cxx11::string::_M_assign((string *)&this->hex_);
  this->req_sigs_ = data->req_sigs;
  std::__cxx11::string::_M_assign((string *)&this->type_);
  pbVar2 = (data->addresses).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (data->addresses).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 != pbVar1) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->addresses_).
                   super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ,pbVar2);
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != pbVar1);
  }
  std::__cxx11::string::_M_assign((string *)&this->pegout_chain_);
  std::__cxx11::string::_M_assign((string *)&this->pegout_asm_);
  std::__cxx11::string::_M_assign((string *)&this->pegout_hex_);
  this->pegout_req_sigs_ = data->pegout_req_sigs;
  std::__cxx11::string::_M_assign((string *)&this->pegout_type_);
  pbVar2 = (data->pegout_addresses).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (data->pegout_addresses).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 != pbVar1) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->pegout_addresses_).
                   super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ,pbVar2);
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != pbVar1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void ElementsDecodeLockingScript::ConvertFromStruct(
    const ElementsDecodeLockingScriptStruct& data) {
  asm__ = data.asm_;
  hex_ = data.hex;
  req_sigs_ = data.req_sigs;
  type_ = data.type;
  addresses_.ConvertFromStruct(data.addresses);
  pegout_chain_ = data.pegout_chain;
  pegout_asm_ = data.pegout_asm;
  pegout_hex_ = data.pegout_hex;
  pegout_req_sigs_ = data.pegout_req_sigs;
  pegout_type_ = data.pegout_type;
  pegout_addresses_.ConvertFromStruct(data.pegout_addresses);
  ignore_items = data.ignore_items;
}